

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckIfNDefDefine.cxx
# Opt level: O1

bool __thiscall kws::Parser::CheckIfNDefDefine(Parser *this,char *match,bool uppercaseTheDefinition)

{
  char cVar1;
  pointer pcVar2;
  string *psVar3;
  undefined4 uVar4;
  int iVar5;
  long lVar6;
  char *__s;
  ulong uVar7;
  size_t pos;
  undefined8 uVar8;
  long *plVar9;
  size_t sVar10;
  long *plVar11;
  undefined7 in_register_00000011;
  long lVar12;
  string *psVar13;
  byte bVar14;
  char *pcVar15;
  bool bVar16;
  bool bVar17;
  Error error;
  string toMatch;
  string ifndef;
  string l;
  string extension;
  string nameofclass;
  string define;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 local_198 [24];
  _Alloc_hider local_180;
  char *local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  undefined4 local_15c;
  string *local_158;
  undefined4 local_14c;
  char *local_148;
  size_t local_140;
  char local_138 [16];
  size_t local_128;
  undefined1 *local_120;
  size_t local_118;
  undefined1 local_110 [16];
  char *local_100;
  string *local_f8;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70;
  size_t local_68;
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  bVar14 = 0;
  lVar6 = std::__cxx11::string::find((char *)&this->m_Filename,0x17827d,0);
  if (lVar6 == -1) {
    local_14c = (undefined4)CONCAT71(in_register_00000011,uppercaseTheDefinition);
    this->m_TestsDone[0xe] = true;
    local_f8 = &this->m_Filename;
    __s = (char *)operator_new__(0x200);
    builtin_strncpy(__s,"#ifndef/#define should match ",0x1e);
    pcVar15 = (char *)this->m_TestsDescription[0xe]._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)(this->m_TestsDescription + 0xe),0,pcVar15,(ulong)__s);
    local_100 = match;
    std::__cxx11::string::string((string *)local_f0,match,(allocator *)local_198);
    uVar7 = std::__cxx11::string::find((char *)local_f0,0x178498,0);
    if (uVar7 != 0xffffffffffffffff) {
      do {
        std::__cxx11::string::replace((ulong)local_f0,uVar7,(char *)0x1,0x177644);
        uVar7 = std::__cxx11::string::find((char *)local_f0,0x178498,0);
      } while (uVar7 != 0xffffffffffffffff);
    }
    uVar7 = std::__cxx11::string::find((char *)local_f0,0x1779c2,0);
    if (uVar7 != 0xffffffffffffffff) {
      do {
        std::__cxx11::string::replace((ulong)local_f0,uVar7,(char *)0x1,0x177649);
        uVar7 = std::__cxx11::string::find((char *)local_f0,0x1779c2,0);
      } while (uVar7 != 0xffffffffffffffff);
    }
    std::__cxx11::string::_M_append((char *)(this->m_TestsDescription + 0xe),(ulong)local_f0[0]);
    operator_delete__(__s);
    psVar13 = &this->m_BufferNoComment;
    pos = std::__cxx11::string::find((char *)psVar13,0x17829e,0);
    if (pos == 0xffffffffffffffff) {
      bVar16 = true;
    }
    else if ((long)pos < 1) {
      bVar16 = false;
    }
    else {
      sVar10 = 0;
      bVar16 = false;
      do {
        cVar1 = (psVar13->_M_dataplus)._M_p[sVar10];
        if (((cVar1 != '\r') && (cVar1 != ' ')) && (cVar1 != '\n')) {
          bVar16 = true;
        }
        sVar10 = sVar10 + 1;
      } while (pos != sVar10);
    }
    psVar3 = psVar13;
    sVar10 = pos;
    if (bVar16) {
      local_178 = (char *)0x0;
      local_170._M_local_buf[0] = '\0';
      local_180._M_p = (pointer)&local_170;
      local_198._0_8_ = GetLineNumber(this,0,true);
      local_198._16_8_ = 0xe;
      local_198._8_8_ = local_198._0_8_;
      std::__cxx11::string::_M_replace((ulong)&local_180,0,local_178,0x1782a6);
      std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                (&this->m_ErrorList,(value_type *)local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_p != &local_170) {
        operator_delete(local_180._M_p);
      }
      bVar14 = 0;
    }
    else {
      do {
        local_128 = sVar10;
        local_158 = psVar3;
        if (bVar16) {
          local_178 = (char *)0x0;
          local_170._M_local_buf[0] = '\0';
          local_180._M_p = (pointer)&local_170;
          local_198._0_8_ = GetLineNumber(this,local_128,true);
          local_198._16_8_ = 0xe;
          local_198._8_8_ = local_198._0_8_;
          std::__cxx11::string::_M_replace((ulong)&local_180,0,local_178,0x178344);
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                    (&this->m_ErrorList,(value_type *)local_198);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_p != &local_170) {
            operator_delete(local_180._M_p);
          }
          bVar14 = 1;
          break;
        }
        pcVar2 = (psVar13->_M_dataplus)._M_p;
        pos = pos + 7;
        do {
          lVar6 = pos + 1;
          pos = pos + 1;
        } while (pcVar2[lVar6] == ' ');
        while ((uVar7 = (ulong)(byte)pcVar2[pos], 0x20 < uVar7 ||
               ((0x100002400U >> (uVar7 & 0x3f) & 1) == 0))) {
          pos = pos + 1;
        }
        std::__cxx11::string::substr((ulong)&local_120,(ulong)psVar13);
        lVar6 = std::__cxx11::string::find((char *)psVar13,0x1782ba,pos);
        if (lVar6 == -1) {
          local_178 = (char *)0x0;
          local_170._M_local_buf[0] = '\0';
          local_180._M_p = (pointer)&local_170;
          local_198._0_8_ = GetLineNumber(this,pos,true);
          local_198._16_8_ = 0xe;
          local_198._8_8_ = local_198._0_8_;
          std::__cxx11::string::_M_replace((ulong)&local_180,0,local_178,0x1782c2);
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                    (&this->m_ErrorList,(value_type *)local_198);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_p != &local_170) {
            operator_delete(local_180._M_p);
          }
          local_15c = 0;
          __s = (char *)0x0;
        }
        else {
          pcVar2 = (psVar13->_M_dataplus)._M_p;
          lVar6 = lVar6 + 6;
          do {
            lVar12 = lVar6 + 1;
            lVar6 = lVar6 + 1;
          } while (pcVar2[lVar12] == ' ');
          lVar12 = 0;
          while ((uVar7 = (ulong)(byte)pcVar2[lVar12 + lVar6], 0x20 < uVar7 ||
                 ((0x100002400U >> (uVar7 & 0x3f) & 1) == 0))) {
            lVar12 = lVar12 + 1;
          }
          uVar8 = std::__cxx11::string::substr((ulong)&local_70,(ulong)local_158);
          uVar4 = (undefined4)CONCAT71((int7)((ulong)uVar8 >> 8),1);
          if (local_118 == local_68) {
            if (local_118 == 0) {
              uVar4 = 0;
            }
            else {
              iVar5 = bcmp(local_120,local_70,local_118);
              uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),iVar5 != 0);
            }
          }
          psVar3 = local_f8;
          psVar13 = local_158;
          local_15c = uVar4;
          if ((char)uVar4 == '\0') {
            if ((this->m_Filename)._M_string_length == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"CheckIfNDefDefine() : m_Filename should be set",0x2e
                        );
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
              std::ostream::put('h');
              std::ostream::flush();
              __s = (char *)0x0;
              psVar13 = local_158;
            }
            else {
              std::__cxx11::string::find_last_of((char *)local_f8,0x179451,0xffffffffffffffff);
              std::__cxx11::string::find_last_of((char *)psVar3,0x16b541,0xffffffffffffffff);
              std::__cxx11::string::substr((ulong)local_90,(ulong)psVar3);
              std::__cxx11::string::substr((ulong)local_b0,(ulong)psVar3);
              std::__cxx11::string::string((string *)&local_148,local_100,(allocator *)local_198);
              uVar7 = std::__cxx11::string::find((char *)&local_148,0x178305,0);
              if (uVar7 != 0xffffffffffffffff) {
                std::__cxx11::string::replace
                          ((ulong)&local_148,uVar7,(char *)0xd,(ulong)local_90[0]);
              }
              uVar7 = std::__cxx11::string::find((char *)&local_148,0x16a49e,0);
              if (uVar7 != 0xffffffffffffffff) {
                std::__cxx11::string::replace
                          ((ulong)&local_148,uVar7,(char *)0xb,(ulong)local_b0[0]);
              }
              if (((char)local_14c != '\0') && (pcVar15 = local_148, local_140 != 0)) {
                do {
                  iVar5 = toupper((int)*pcVar15);
                  *pcVar15 = (char)iVar5;
                  pcVar15 = pcVar15 + 1;
                } while (pcVar15 != local_148 + local_140);
              }
              bVar17 = true;
              if (local_118 == local_140) {
                if (local_118 == 0) {
                  bVar17 = false;
                }
                else {
                  iVar5 = bcmp(local_120,local_148,local_118);
                  bVar17 = iVar5 != 0;
                }
              }
              if (bVar17 != false) {
                local_178 = (char *)0x0;
                local_170._M_local_buf[0] = '\0';
                local_180._M_p = (pointer)&local_170;
                local_198._0_8_ = GetLineNumber(this,local_128,true);
                local_198._8_8_ = GetLineNumber(this,lVar6 + lVar12,true);
                local_198._16_8_ = 0xe;
                std::__cxx11::string::_M_replace((ulong)&local_180,0,local_178,0x178313);
                local_50[0] = local_40;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_50,local_120,local_120 + local_118);
                std::__cxx11::string::append((char *)local_50);
                plVar9 = (long *)std::__cxx11::string::_M_append((char *)local_50,(ulong)local_148);
                plVar11 = plVar9 + 2;
                if ((long *)*plVar9 == plVar11) {
                  local_c0 = *plVar11;
                  lStack_b8 = plVar9[3];
                  local_d0 = &local_c0;
                }
                else {
                  local_c0 = *plVar11;
                  local_d0 = (long *)*plVar9;
                }
                local_c8 = plVar9[1];
                *plVar9 = (long)plVar11;
                plVar9[1] = 0;
                *(undefined1 *)(plVar9 + 2) = 0;
                std::__cxx11::string::operator=((string *)&local_180,(string *)&local_d0);
                if (local_d0 != &local_c0) {
                  operator_delete(local_d0);
                }
                if (local_50[0] != local_40) {
                  operator_delete(local_50[0]);
                }
                std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                          (&this->m_ErrorList,(value_type *)local_198);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_180._M_p != &local_170) {
                  operator_delete(local_180._M_p);
                }
              }
              if (local_148 != local_138) {
                operator_delete(local_148);
              }
              psVar13 = local_158;
              if (local_b0[0] != local_a0) {
                operator_delete(local_b0[0]);
              }
              if (local_90[0] != local_80) {
                operator_delete(local_90[0]);
              }
              __s = (char *)(ulong)(bVar17 ^ 1);
            }
          }
          else {
            pos = std::__cxx11::string::find((char *)local_158,0x17829e,pos + 1);
            if (pos == 0xffffffffffffffff) {
              bVar16 = true;
            }
          }
          if (local_70 != local_60) {
            operator_delete(local_70);
          }
        }
        bVar14 = (byte)__s;
        if (local_120 != local_110) {
          operator_delete(local_120);
        }
        psVar3 = local_158;
        sVar10 = local_128;
      } while ((char)local_15c != '\0');
    }
    if (local_f0[0] != local_e0) {
      operator_delete(local_f0[0]);
    }
  }
  return (bool)(bVar14 & 1);
}

Assistant:

bool Parser::CheckIfNDefDefine(const char* match, bool uppercaseTheDefinition)
{
  // Check only if we are not a .cxx or .cc or .c file
  if(m_Filename.find(".c") != std::string::npos)
    {
    return false;
    }

  m_TestsDone[NDEFINE] = true;
  constexpr size_t length = 512;
  char* val = new char[length];
  snprintf(val,length,"#ifndef/#define should match ");
  m_TestsDescription[NDEFINE] = val;
  // Replace < and >
  std::string l = match;
  auto inf = static_cast<long int>(l.find("<", 0));
  while(inf != -1)
    {
    l.replace(inf,1,"&lt;");
    inf = static_cast<long int>(l.find("<",0));
    }

    auto sup = static_cast<long int>(l.find(">", 0));
    while (sup != -1) {
      l.replace(sup, 1, "&gt;");
      sup = static_cast<long int>(l.find(">", 0));
    }
  m_TestsDescription[NDEFINE] += l;
  delete [] val;

  bool hasError = false;
  bool notDefined = false;


  // We should have a #ifndef/#define on the same line and we go
  // through the file until we find a correct match.
  bool doesMatch = true;

  // Find the #ifndef word in the file
  auto pos = static_cast<long int>(m_BufferNoComment.find("#ifndef", 0));
  if(pos == -1)
    {
    notDefined = true;
    }
  else
    {
    for(long int i=0;i<pos;i++)
      {
      if((m_BufferNoComment[i] != ' ')
        && (m_BufferNoComment[i] != '\r')
        && (m_BufferNoComment[i] != '\n')
        )
        {
        notDefined = true;
        }
      }
    }

  long int definepos = pos;

  if(notDefined)
    {
    Error error;
    error.line = this->GetLineNumber(0,true);
    error.line2 = error.line;
    error.number = NDEFINE;
    error.description = "#ifndef not defined";
    m_ErrorList.push_back(error);
    return false;
    }

  while(!notDefined)
    {
    doesMatch = true;

    // Find the word after #ifndef
    pos += 8;
   
    while(m_BufferNoComment[pos] == ' ')
      {
      pos++;
      }
    long int begin = pos;
    while((m_BufferNoComment[pos] != ' ') 
      &&(m_BufferNoComment[pos] != '\r')
      &&(m_BufferNoComment[pos] != '\n')
      )
      {
      pos++;
      }
    long int end = pos;
    std::string ifndef = m_BufferNoComment.substr(begin,end-begin);

    // Find the word after #define
    auto posDef = static_cast<long int>(m_BufferNoComment.find("#define", end));

    if(posDef == -1)
      {
      Error error;
      error.line = this->GetLineNumber(end,true);
      error.line2 = error.line;
      error.number = NDEFINE;
      error.description = "#define not defined";
      m_ErrorList.push_back(error);
      return false;
      }
    
    posDef += 7; 
    while(m_BufferNoComment[posDef] == ' ')
      {
      posDef++;
      }
    begin = posDef;
    while((m_BufferNoComment[posDef] != ' ') 
      &&(m_BufferNoComment[posDef] != '\r')
      &&(m_BufferNoComment[posDef] != '\n')
      )
      {
      posDef++;
      }
    end = posDef;
    std::string define = m_BufferNoComment.substr(begin,end-begin);

    if(ifndef != define)
      {
      doesMatch = false;
      }

    if(doesMatch)
      {
      if (m_Filename.empty()) {
        std::cout << "CheckIfNDefDefine() : m_Filename should be set" << std::endl;
        return false;
      }

      auto point = static_cast<long int>(m_Filename.find_last_of("."));
      auto slash = static_cast<long int>(m_Filename.find_last_of("/"));

      std::string nameofclass = m_Filename.substr(slash+1,point-slash-1);
      std::string extension = m_Filename.substr(point+1,m_Filename.size()-point-1);

      // construct the string
      std::string toMatch = match;
      auto posnofc = static_cast<long int>(toMatch.find("[NameOfClass]"));
      if(posnofc != -1)
        {
        toMatch.replace(posnofc,13,nameofclass);
        }
      posnofc = static_cast<long int>(toMatch.find("[Extension]"));
      if(posnofc != -1)
        {
        toMatch.replace(posnofc,11,extension);
        }

      if(uppercaseTheDefinition)
        {
        for(std::string::iterator it = toMatch.begin(); it != toMatch.end(); it++)
          *it = static_cast<char>(std::toupper(*it));
        }

      if(ifndef != toMatch)
        {   
        Error error;
        error.line = this->GetLineNumber(definepos,true);
        error.line2 = this->GetLineNumber(end,true);
        error.number = NDEFINE;
        error.description = "#ifndef/#define does not match expression";
        error.description = ifndef+" v.s. "+toMatch;
        m_ErrorList.push_back(error);
        return false;
        }
      else
        {
        return true;
        }
      }

    pos = static_cast<long int>(m_BufferNoComment.find("#ifndef",pos+1));

    if(pos == -1)
      {
      notDefined = true;
      }
    /*else
      {
      for(int i=0;i<pos;i++)
        {
        if((m_BufferNoComment[i] != ' ')
          && (m_BufferNoComment[i] != '\r')
          && (m_BufferNoComment[i] != '\n')
          )
          {
          std::cout << "Not defined!" << std::endl;
          notDefined = true;
          }
        }
      }*/

    } // end looking for entire file


    Error error;
    error.line = this->GetLineNumber(definepos,true);
    error.line2 = error.line;
    error.number = NDEFINE;
    error.description = "#ifndef/#define does not match";
    m_ErrorList.push_back(error);

  return !hasError;
}